

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O2

int __thiscall CommandLineTestRunner::runAllTestsMain(CommandLineTestRunner *this)

{
  TestRegistry *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SimpleString local_50;
  SetPointerPlugin pPlugin;
  
  SimpleString::SimpleString(&local_50,"SetPointerPlugin");
  SetPointerPlugin::SetPointerPlugin(&pPlugin,&local_50);
  SimpleString::~SimpleString(&local_50);
  (*this->registry_->_vptr_TestRegistry[0xd])(this->registry_,&pPlugin);
  iVar3 = (*this->registry_->_vptr_TestRegistry[0xf])();
  bVar2 = parseArguments(this,(TestPlugin *)CONCAT44(extraout_var,iVar3));
  if (bVar2) {
    iVar3 = runAllTests(this);
  }
  else {
    iVar3 = 1;
  }
  pTVar1 = this->registry_;
  SimpleString::SimpleString(&local_50,"SetPointerPlugin");
  (*pTVar1->_vptr_TestRegistry[0x11])(pTVar1,&local_50);
  SimpleString::~SimpleString(&local_50);
  TestPlugin::~TestPlugin(&pPlugin.super_TestPlugin);
  return iVar3;
}

Assistant:

int CommandLineTestRunner::runAllTestsMain()
{
    int testResult = 1;

    SetPointerPlugin pPlugin(DEF_PLUGIN_SET_POINTER);
    registry_->installPlugin(&pPlugin);

    if (parseArguments(registry_->getFirstPlugin()))
        testResult = runAllTests();

    registry_->removePluginByName(DEF_PLUGIN_SET_POINTER);
    return testResult;
}